

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassRegistration
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *field;
  FieldDescriptor *extension;
  int i;
  Descriptor *desc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  for (extension._4_4_ = 0; iVar2 = Descriptor::extension_count(desc), extension._4_4_ < iVar2;
      extension._4_4_ = extension._4_4_ + 1) {
    field = Descriptor::extension(desc,extension._4_4_);
    bVar1 = anon_unknown_0::ShouldGenerateExtension(field);
    if (bVar1) {
      GenerateExtension(this,options,printer,field);
    }
  }
  return;
}

Assistant:

void Generator::GenerateClassRegistration(const GeneratorOptions& options,
                                          io::Printer* printer,
                                          const Descriptor* desc) const {
  // Register any extensions defined inside this message type.
  for (int i = 0; i < desc->extension_count(); i++) {
    const FieldDescriptor* extension = desc->extension(i);
    if (ShouldGenerateExtension(extension)) {
      GenerateExtension(options, printer, extension);
    }
  }
}